

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::JobManager::CollectJobsValue(Value *__return_storage_ptr__,JobManager *this)

{
  bool bVar1;
  reference ppJVar2;
  ulong uVar3;
  reference this_00;
  uint64_t uVar4;
  string_t local_280;
  Value local_260;
  Value local_218;
  string local_1d0 [2];
  exception *e;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_160;
  input_adapter local_140;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_130;
  Value local_120;
  undefined1 local_d8 [8];
  string valueStr;
  bool condition;
  Job **job;
  iterator __end2;
  iterator __begin2;
  JobPool *__range2;
  uint64_t xpan;
  json json;
  JobManager *this_local;
  Value *value;
  
  json.m_value.number_integer._7_1_ = 0;
  Interpreter::Value::Value(__return_storage_ptr__);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&xpan,(nullptr_t)0x0);
  __end2 = std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::begin
                     (&this->mJobPool);
  job = (Job **)std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::end
                          (&this->mJobPool);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
                                *)&job);
    if (!bVar1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump(&local_280,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)&xpan,4,' ',false,strict);
      Interpreter::Value::Value(&local_260,&local_280);
      Interpreter::Value::operator=(__return_storage_ptr__,&local_260);
      Interpreter::Value::~Value(&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      json.m_value.number_integer._7_1_ = 1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&xpan);
      if ((json.m_value.number_unsigned._7_1_ & 1) == 0) {
        Interpreter::Value::~Value(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    ppJVar2 = __gnu_cxx::
              __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
              ::operator*(&__end2);
    bVar1 = Job::IsStopped(*ppJVar2);
    if (!bVar1) break;
    Job::GetValue((Value *)((long)&valueStr.field_2 + 8),*ppJVar2);
    bVar1 = Interpreter::Value::HasNoError((Value *)((long)&valueStr.field_2 + 8));
    Interpreter::Value::~Value((Value *)((long)&valueStr.field_2 + 8));
    if (bVar1) {
      uVar4 = Job::GetXpanId(*ppJVar2);
      Job::GetValue(&local_120,*ppJVar2);
      Interpreter::Value::ToString_abi_cxx11_((string *)local_d8,&local_120);
      Interpreter::Value::~Value(&local_120);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_d8,"true");
      }
      nlohmann::detail::input_adapter::
      input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      std::
      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
      ::function(&local_160,(nullptr_t)0x0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse(&local_130,&local_140,&local_160,true);
      utils::Hex<unsigned_long>((string *)&e,uVar4);
      this_00 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)&xpan,(key_type *)&e);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(this_00,&local_130);
      std::__cxx11::string::~string((string *)&e);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_130);
      std::
      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
      ::~function(&local_160);
      nlohmann::detail::input_adapter::~input_adapter(&local_140);
      std::__cxx11::string::~string((string *)local_d8);
    }
    else {
      uVar4 = Job::GetXpanId(*ppJVar2);
      Job::GetValue(&local_218,*ppJVar2);
      Interpreter::Value::ToString_abi_cxx11_(local_1d0,&local_218);
      ErrorMsg(this,uVar4,local_1d0);
      std::__cxx11::string::~string((string *)local_1d0);
      Interpreter::Value::~Value(&local_218);
    }
    __gnu_cxx::
    __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x2a8,"Interpreter::Value ot::commissioner::JobManager::CollectJobsValue()");
}

Assistant:

Interpreter::Value JobManager::CollectJobsValue()
{
    Interpreter::Value value;
    nlohmann::json     json;
    uint64_t           xpan;

    for (const auto &job : mJobPool)
    {
        ASSERT(job->IsStopped());
        if (job->GetValue().HasNoError())
        {
            xpan = job->GetXpanId();
            try
            {
                std::string valueStr = job->GetValue().ToString();
                if (valueStr.empty())
                {
                    // this may occur with non-dataset commands
                    // like 'start', 'stop', etc.
                    valueStr = "true";
                    // please note, this is where job-based execution
                    // is different from single command run when
                    // nothing but [done] is printed; we need to see a
                    // distinguished result per network
                }
                json[utils::Hex(xpan)] = nlohmann::json::parse(valueStr);
            } catch (std::exception &e)
            {
                ErrorMsg(xpan, e.what());
            }
        }
        else // produce error messages immediately before printing value
        {
            ErrorMsg(job->GetXpanId(), job->GetValue().ToString());
        }
    }
    value = json.dump(JSON_INDENT_DEFAULT);
    return value;
}